

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  Message *pMVar1;
  MutexLock lock;
  LogMessageFatal local_20;
  
  if (type != (Descriptor *)0x0) {
    local_20.super_LogMessage._0_8_ = &this->prototypes_mutex_;
    absl::lts_20250127::Mutex::Lock((Mutex *)local_20.super_LogMessage._0_8_);
    pMVar1 = GetPrototypeNoLock(this,type);
    absl::lts_20250127::MutexLock::~MutexLock((MutexLock *)&local_20);
    return pMVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/dynamic_message.cc"
             ,0x303,"type != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

const Message* PROTOBUF_NONNULL
DynamicMessageFactory::GetPrototype(const Descriptor* PROTOBUF_NONNULL type) {
  ABSL_CHECK(type != nullptr);
  absl::MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}